

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void serialize_model<_IO_FILE*>(TreesIndexer *model,_IO_FILE **out)

{
  pointer pSVar1;
  SingleTreeIndex *tree;
  pointer node;
  size_t vec_size;
  
  if (!interrupt_switch) {
    vec_size = ((long)(model->indices).
                      super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(model->indices).
                     super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x98;
    write_bytes<unsigned_long>(&vec_size,1,out);
    pSVar1 = (model->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (node = (model->indices).
                super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                super__Vector_impl_data._M_start; node != pSVar1; node = node + 1) {
      serialize_node<_IO_FILE*>(node,out);
    }
  }
  return;
}

Assistant:

void serialize_model(const TreesIndexer &model, otype &out)
{
    if (interrupt_switch) return;

    size_t vec_size = model.indices.size();
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);

    for (const auto &tree : model.indices)
        serialize_node(tree, out);
}